

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall
o3dgc::Adaptive_Data_Model::set_alphabet(Adaptive_Data_Model *this,uint number_of_symbols)

{
  char cVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  
  if (0xfffff800 < number_of_symbols - 0x801) {
    if (this->data_symbols != number_of_symbols) {
      this->data_symbols = number_of_symbols;
      this->last_symbol = number_of_symbols - 1;
      if (this->distribution != (uint *)0x0) {
        operator_delete__(this->distribution);
        number_of_symbols = this->data_symbols;
      }
      if (number_of_symbols < 0x11) {
        this->decoder_table = (uint *)0x0;
        this->table_size = 0;
        this->table_shift = 0;
        puVar3 = (uint *)operator_new__((ulong)(number_of_symbols * 8));
        this->distribution = puVar3;
      }
      else {
        iVar2 = -0xd;
        do {
          cVar1 = (char)iVar2;
          iVar2 = iVar2 + 1;
        } while ((uint)(1 << (cVar1 + 0x12U & 0x1f)) < number_of_symbols);
        uVar4 = 1 << (cVar1 + 0x10U & 0x1f);
        this->table_size = uVar4;
        this->table_shift = -iVar2;
        puVar3 = (uint *)operator_new__((ulong)(uVar4 + number_of_symbols * 2 + 2) << 2);
        this->distribution = puVar3;
        this->decoder_table = puVar3 + number_of_symbols * 2;
      }
      this->symbol_count = puVar3 + number_of_symbols;
    }
    reset(this);
    return;
  }
  AC_Error("invalid number of data symbols");
}

Assistant:

void Adaptive_Data_Model::set_alphabet(unsigned number_of_symbols)
    {
      if ((number_of_symbols < 2) || (number_of_symbols > (1 << 11)))
        AC_Error("invalid number of data symbols");

      if (data_symbols != number_of_symbols) {     // assign memory for data model
        data_symbols = number_of_symbols;
        last_symbol = data_symbols - 1;
        delete [] distribution;
                                         // define size of table for fast decoding
        if (data_symbols > 16) {
          unsigned table_bits = 3;
          while (data_symbols > (1U << (table_bits + 2))) ++table_bits;
          table_size  = 1 << table_bits;
          table_shift = DM__LengthShift - table_bits;
          distribution = new unsigned[2*data_symbols+table_size+2];
          decoder_table = distribution + 2 * data_symbols;
        }
        else {                                  // small alphabet: no table needed
          decoder_table = 0;
          table_size = table_shift = 0;
          distribution = new unsigned[2*data_symbols];
        }
        symbol_count = distribution + data_symbols;
        if (distribution == 0) AC_Error("cannot assign model memory");
      }

      reset();                                                 // initialize model
    }